

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

IntrusiveList<SynModuleImport> ParseImports(ParseContext *ctx)

{
  bool bVar1;
  SynModuleImport *node;
  SynModuleImport *import;
  ParseContext *ctx_local;
  IntrusiveList<SynModuleImport> imports;
  
  IntrusiveList<SynModuleImport>::IntrusiveList((IntrusiveList<SynModuleImport> *)&ctx_local);
  while (bVar1 = ParseContext::At(ctx,lex_import), bVar1) {
    node = ParseImport(ctx);
    if (node != (SynModuleImport *)0x0) {
      IntrusiveList<SynModuleImport>::push_back((IntrusiveList<SynModuleImport> *)&ctx_local,node);
    }
  }
  return _ctx_local;
}

Assistant:

IntrusiveList<SynModuleImport> ParseImports(ParseContext &ctx)
{
	IntrusiveList<SynModuleImport> imports;

	while(ctx.At(lex_import))
	{
		if(SynModuleImport *import = ParseImport(ctx))
			imports.push_back(import);
	}

	return imports;
}